

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlInitNodeInfoSeq(void)

{
  int iVar1;
  int iVar2;
  xmlParserNodeInfoSeqPtr val;
  int local_1c;
  int n_seq;
  xmlParserNodeInfoSeqPtr seq;
  int mem_base;
  int test_ret;
  
  seq._4_4_ = 0;
  for (local_1c = 0; local_1c < 1; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlParserNodeInfoSeqPtr(local_1c,0);
    xmlInitNodeInfoSeq(val);
    call_tests = call_tests + 1;
    des_xmlParserNodeInfoSeqPtr(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlInitNodeInfoSeq",(ulong)(uint)(iVar2 - iVar1));
      seq._4_4_ = seq._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return seq._4_4_;
}

Assistant:

static int
test_xmlInitNodeInfoSeq(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserNodeInfoSeqPtr seq; /* a node info sequence pointer */
    int n_seq;

    for (n_seq = 0;n_seq < gen_nb_xmlParserNodeInfoSeqPtr;n_seq++) {
        mem_base = xmlMemBlocks();
        seq = gen_xmlParserNodeInfoSeqPtr(n_seq, 0);

        xmlInitNodeInfoSeq(seq);
        call_tests++;
        des_xmlParserNodeInfoSeqPtr(n_seq, seq, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlInitNodeInfoSeq",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_seq);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}